

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

int Of_SetAddCut(Of_Cut_t **pCuts,int nCuts,int nCutNum)

{
  Of_Cut_t *pOVar1;
  Of_Cut_t *pOVar2;
  int iVar3;
  Of_Cut_t *t;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  int nSizeC;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  if (nCuts == 0) {
    return 1;
  }
  if (0 < nCuts) {
    uVar5 = (ulong)(uint)nCuts;
    bVar6 = true;
    uVar4 = 0;
LAB_0075b455:
    pOVar1 = pCuts[uVar5];
    uVar8 = *(uint *)&pOVar1->field_0x10 >> 0x1b;
    do {
      pOVar2 = pCuts[uVar4];
      uVar10 = *(uint *)&pOVar2->field_0x10 >> 0x1b;
      if ((uVar8 < uVar10) && ((pOVar1->Sign & ~pOVar2->Sign) == 0)) {
        if (*(uint *)&pOVar1->field_0x10 < 0x8000000) goto LAB_0075b4bc;
        uVar11 = 0;
        uVar9 = 0;
        do {
          if (pOVar1->pLeaves[(int)uVar9] < pOVar2->pLeaves[uVar11]) break;
          if ((pOVar2->pLeaves[uVar11] == pOVar1->pLeaves[(int)uVar9]) &&
             (uVar9 = uVar9 + 1, uVar9 == uVar8)) goto LAB_0075b4bc;
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      uVar4 = uVar4 + 1;
      if (uVar4 == uVar5) {
        if (!bVar6) goto LAB_0075b4e2;
        goto LAB_0075b518;
      }
    } while( true );
  }
  goto LAB_0075b567;
LAB_0075b4bc:
  *(uint *)&pOVar2->field_0x10 = *(uint *)&pOVar2->field_0x10 | 0xf8000000;
  uVar4 = uVar4 + 1;
  bVar6 = false;
  if (uVar4 == uVar5) goto LAB_0075b4e2;
  goto LAB_0075b455;
LAB_0075b4e2:
  uVar5 = 0;
  iVar3 = 0;
  do {
    if (*(uint *)&pCuts[uVar5]->field_0x10 < 0xf8000000) {
      lVar7 = (long)iVar3;
      if (lVar7 < (long)uVar5) {
        pOVar1 = pCuts[lVar7];
        pCuts[lVar7] = pCuts[uVar5];
        pCuts[uVar5] = pOVar1;
      }
      iVar3 = iVar3 + 1;
    }
    uVar5 = uVar5 + 1;
  } while (nCuts + 1 != uVar5);
  nCuts = iVar3 - 1;
LAB_0075b518:
  uVar8 = nCuts;
  if (0 < nCuts) {
    while( true ) {
      pOVar1 = pCuts[(ulong)uVar8 - 1];
      pOVar2 = pCuts[uVar8];
      if (pOVar1->Delay < pOVar2->Delay) break;
      if (pOVar1->Delay <= pOVar2->Delay) {
        if ((pOVar1->Flow < pOVar2->Flow) ||
           ((pOVar1->Flow <= pOVar2->Flow &&
            (*(uint *)&pOVar1->field_0x10 >> 0x1b < *(uint *)&pOVar2->field_0x10 >> 0x1b)))) break;
      }
      pCuts[(ulong)uVar8 - 1] = pOVar2;
      pCuts[uVar8] = pOVar1;
      bVar6 = (int)uVar8 < 2;
      uVar8 = uVar8 - 1;
      if (bVar6) break;
    }
  }
LAB_0075b567:
  iVar3 = nCutNum + -1;
  if ((int)(nCuts + 1U) < nCutNum + -1) {
    iVar3 = nCuts + 1U;
  }
  return iVar3;
}

Assistant:

static inline int Of_SetAddCut( Of_Cut_t ** pCuts, int nCuts, int nCutNum )
{
    if ( nCuts == 0 )
        return 1;
    nCuts = Of_SetLastCutContainsArea(pCuts, nCuts);
    Of_SetSortByArea( pCuts, nCuts );
    return Abc_MinInt( nCuts + 1, nCutNum - 1 );
}